

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_non_uniform_aware_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  
  to_expression_abi_cxx11_(__return_storage_ptr__,this,id,true);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)id,DecorationNonUniform);
  if (bVar1) {
    convert_non_uniform_expression(this,__return_storage_ptr__,id);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_non_uniform_aware_expression(uint32_t id)
{
	string expr = to_expression(id);

	if (has_decoration(id, DecorationNonUniform))
		convert_non_uniform_expression(expr, id);

	return expr;
}